

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adam_benchmark.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  char *__nptr;
  bool bVar2;
  value_type *__val;
  iterator iVar3;
  int *piVar4;
  ulong uVar5;
  ostream *poVar6;
  rep rVar7;
  undefined8 uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  pointer pcVar12;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>
  __l;
  vector<char,_std::allocator<char>_> inBuffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dest;
  FuncMap funcMap;
  vector<char,_std::allocator<char>_> local_1c8;
  char *local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  double local_190;
  char *local_188;
  _Any_data local_180;
  code *local_170;
  undefined1 local_160 [48];
  code *local_130;
  code *pcStack_128;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  code *local_100;
  undefined8 uStack_f8;
  code *local_f0;
  code *pcStack_e8;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  code *local_c0;
  undefined8 uStack_b8;
  code *local_b0;
  code *pcStack_a8;
  long *local_a0 [2];
  long local_90 [2];
  code *local_80;
  undefined8 uStack_78;
  code *local_70 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
  local_60;
  
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a8,argv,
             argv + argc,(allocator_type *)local_160);
  if ((long)local_1a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_1a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x80) {
    local_160._0_8_ = local_160 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"c","");
    local_160._40_8_ = 0;
    local_160._32_8_ = testCFileIO;
    pcStack_128 = std::
                  _Function_handler<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_void_(*)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
                  ::_M_invoke;
    local_130 = std::
                _Function_handler<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_void_(*)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
                ::_M_manager;
    local_120[0] = local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"posix","");
    uStack_f8 = 0;
    local_100 = testPosixIO;
    pcStack_e8 = std::
                 _Function_handler<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_void_(*)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
                 ::_M_invoke;
    local_f0 = std::
               _Function_handler<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_void_(*)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
               ::_M_manager;
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"c++","");
    uStack_b8 = 0;
    local_c0 = testCppIO;
    pcStack_a8 = std::
                 _Function_handler<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_void_(*)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
                 ::_M_invoke;
    local_b0 = std::
               _Function_handler<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_void_(*)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
               ::_M_manager;
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"modern","");
    uStack_78 = 0;
    local_80 = testModernIO;
    local_70[1] = std::
                  _Function_handler<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_void_(*)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
                  ::_M_invoke;
    local_70[0] = std::
                  _Function_handler<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_void_(*)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
                  ::_M_manager;
    __l._M_len = 4;
    __l._M_array = (iterator)local_160;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
           *)&local_60,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &local_1c8,(allocator_type *)&local_1b0);
    lVar11 = 0;
    do {
      if (*(code **)((long)local_70 + lVar11) != (code *)0x0) {
        (**(code **)((long)local_70 + lVar11))((long)&local_80 + lVar11,(long)&local_80 + lVar11,3);
      }
      if ((void *)((long)local_90 + lVar11) != *(void **)((long)local_a0 + lVar11)) {
        operator_delete(*(void **)((long)local_a0 + lVar11),*(long *)((long)local_90 + lVar11) + 1);
      }
      lVar11 = lVar11 + -0x40;
    } while (lVar11 != -0x100);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
            ::find(&local_60,
                   local_1a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
    if ((_Rb_tree_header *)iVar3._M_node == &local_60._M_impl.super__Rb_tree_header) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Not supported copy method: ",0x1b);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          local_1a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                          local_1a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    else {
      local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(0x100000);
      pcVar12 = local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start + 0x100000;
      local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pcVar12;
      memset(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0,0x100000);
      local_160._0_8_ = local_160 + 0x10;
      pcVar1 = local_1a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
      local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_160,pcVar1,
                 pcVar1 + local_1a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
      std::__cxx11::string::append(local_160);
      __nptr = local_1a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
      piVar4 = __errno_location();
      iVar9 = *piVar4;
      *piVar4 = 0;
      uVar5 = strtoul(__nptr,&local_1b0,10);
      if (local_1b0 == __nptr) {
        uVar8 = std::__throw_invalid_argument("stoul");
        if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
          operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
        }
        if (local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
        ::~_Rb_tree(&local_60);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1a8);
        _Unwind_Resume(uVar8);
      }
      if (*piVar4 == 0) {
        *piVar4 = iVar9;
      }
      else if (*piVar4 == 0x22) {
        std::__throw_out_of_range("stoul");
        goto LAB_00105fce;
      }
      if (uVar5 == 0) {
        local_190 = 0.0;
      }
      else {
        lVar11 = 0;
        uVar10 = 1;
        do {
          std::
          function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>::
          function((function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
                    *)&local_180,
                   (function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
                    *)(iVar3._M_node + 2));
          local_1b0 = local_1a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          local_188 = (char *)local_160._0_8_;
          rVar7 = measure::
                  ms<std::function<void(char_const*,char_const*,std::vector<char,std::allocator<char>>&)>,char_const*,char_const*,std::vector<char,std::allocator<char>>&>
                            ((function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
                              *)&local_180,&local_1b0,&local_188,&local_1c8);
          if (local_170 != (code *)0x0) {
            (*local_170)(&local_180,&local_180,__destroy_functor);
          }
          lVar11 = lVar11 + rVar7;
          unlink((char *)local_160._0_8_);
          bVar2 = uVar10 < uVar5;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar2);
        local_190 = (double)lVar11;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Average ",8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          local_1a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                          local_1a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," I/O took: ",0xb);
      poVar6 = std::ostream::_M_insert<double>(local_190 / (double)(long)uVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"ms",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      if (local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
    ::~_Rb_tree(&local_60);
    iVar9 = 0;
  }
  else {
LAB_00105fce:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        ((local_1a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (local_1a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," copy_method (c, posix, c++) in_file number_of_times",0x34);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    iVar9 = 1;
    std::ostream::flush();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  return iVar9;
}

Assistant:

int main(int argc, char* argv[])
{
    std::vector<std::string> args(argv, argv + argc);
    if (args.size() != 4)
    {
        std::cout << "Usage: " << args[0] << " copy_method (c, posix, c++) in_file number_of_times" << std::endl;
        return 1;
    }

    typedef std::map<std::string, std::function<void (const char*, const char*, std::vector<char>&)>> FuncMap;
    FuncMap funcMap { {"c", testCFileIO}, {"posix", testPosixIO}, {"c++", testCppIO}, {"modern", testModernIO}};

    auto it = funcMap.find(args[1]);
    if (it != funcMap.end())
    {
        std::vector<char> inBuffer(1024 * 1024);

        auto dest = args[2] + ".copy";
        const auto times = std::stoul(args[3]);

        milliseconds::rep total = 0;
        for (unsigned int i = 0; i < times; ++i)
        {
            total += measure::ms(it->second, args[2].c_str(), dest.c_str(), inBuffer);
            ::unlink(dest.c_str());
        }
        std::cout << "Average " << args[1] << " I/O took: " << total / double(times) << "ms" << std::endl;
    }
    else
    {
        std::cout << "Not supported copy method: " << args[1] << std::endl;
    }
}